

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketFactory.h
# Opt level: O0

void __thiscall
gmlc::networking::SocketFactory::SocketFactory(SocketFactory *this,string *conf,bool is_file)

{
  byte bVar1;
  byte in_DL;
  SocketFactory *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *in_stack_00000358;
  SocketFactory *in_stack_00000360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffe8;
  
  bVar1 = in_DL & 1;
  std::enable_shared_from_this<gmlc::networking::SocketFactory>::enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::SocketFactory> *)0x4c1d95);
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  (in_RDI->field_2)._M_local_buf[1] = '\0';
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::string(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    parse_json_config(in_RSI,(string *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
    std::__cxx11::string::~string(in_RDI);
  }
  else {
    std::__cxx11::string::string(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    load_json_config_file(in_stack_00000360,in_stack_00000358);
    std::__cxx11::string::~string(in_RDI);
  }
  return;
}

Assistant:

SocketFactory(const std::string& conf, bool is_file = true)
    {
        if (is_file) {
            load_json_config_file(conf);
        } else {
            parse_json_config(conf);
        }
    }